

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

Matrix4d *
opengv::relative_pose::modules::ge::composeG
          (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
          Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
          Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
          Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
          Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
          Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley)

{
  Scalar SVar1;
  Scalar *pSVar2;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_RCX;
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *in_RDX;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *in_RSI;
  Matrix4d *in_RDI;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *in_R9;
  StorageBaseType *matrix;
  double *scalar;
  Scalar SVar3;
  Scalar SVar4;
  Scalar SVar5;
  Scalar SVar6;
  Scalar SVar7;
  dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
  *in_stack_00000008;
  Vector3d z2PR;
  Vector3d y2PR;
  Vector3d x2PR;
  Vector3d z1PC;
  Vector3d y1PC;
  Vector3d x1PC;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  Matrix<double,_9,_1,_0,_9,_1> Rowst;
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  double temp;
  Vector3d zxFr2t;
  Vector3d zxFr1t;
  Vector3d xyFr2t;
  Vector3d xyFr1t;
  Vector3d yzFr0t;
  Vector3d zzFr0t;
  Vector3d yyFr0t;
  Vector3d xxFr1t;
  rotation_t R;
  Matrix4d *G;
  DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *in_stack_ffffffffffffdac8;
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *in_stack_ffffffffffffdad8;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffdae0;
  dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
  *this;
  double *in_stack_ffffffffffffdb18;
  cayley_t *in_stack_ffffffffffffdba8;
  
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0x125f907);
  math::cayley2rot_reduced(in_stack_ffffffffffffdba8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdae0,
             (Index)in_stack_ffffffffffffdad8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_ffffffffffffdae0,in_stack_ffffffffffffdad8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdae0,
             (Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*(in_stack_ffffffffffffdae0,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX,in_RDX);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)in_RCX,in_RDX);
  matrix = (StorageBaseType *)
           Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_00000008);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x125fd2d);
  *pSVar2 = (Scalar)matrix;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(in_stack_ffffffffffffdb18,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RCX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)in_R9,(MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
                        *)in_RCX);
  scalar = (double *)
           Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                       *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x125fe21);
  *pSVar2 = (double)scalar + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)in_RCX,in_RDX);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_00000008);
  this = in_stack_00000008;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x125feeb);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x125ff6b);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260015);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12600c3);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260143);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12601c6);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260276);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126032a);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12603b0);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260434);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12604e2);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_RSI);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)in_RCX,in_RDX);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double(this);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12605b3);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260639);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12606e9);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126079e);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260824);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12608a9);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260957);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12609db);
  *pSVar2 = SVar4 + *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260a02);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260a25);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260a48);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260a6b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260a8f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260ab3);
  *pSVar2 = SVar1;
  Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0x1260acd);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)in_RCX,(Index)in_RDX,(Index)in_RSI)
  ;
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)in_RSI,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)in_RCX,(Index)in_RDX,(Index)in_RSI)
  ;
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)in_RSI,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,1,9,1,1,9>>::block<1,3>
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)in_RCX,(Index)in_RDX,(Index)in_RSI)
  ;
  Eigen::Block<Eigen::Matrix<double,1,9,1,1,9>,1,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1,_3,_false> *)in_RSI,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,9,1,0,9,1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Matrix<double,_9,_1,_0,_9,_1> *)in_RSI,
             (EigenBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,_9,_1,_0,_9,_1>::Matrix((Matrix<double,_9,_1,_0,_9,_1> *)0x1260be8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_RCX,(Index)in_RDX,(Index)in_RSI)
  ;
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)in_RSI,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_RCX,(Index)in_RDX,(Index)in_RSI)
  ;
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)in_RSI,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col(in_RCX,(Index)in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,9,1,0,9,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_RCX,(Index)in_RDX,(Index)in_RSI)
  ;
  Eigen::Block<Eigen::Matrix<double,9,1,0,9,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_3,_1,_false> *)in_RSI,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             in_stack_ffffffffffffdac8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_RSI,
             (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_RSI,
             (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_RSI,
             (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_RSI,
             (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_RSI,
             (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_RSI,
             (MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,9,0,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)in_stack_ffffffffffffdac8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260e9d);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260f1f);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1260fd3);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261087);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126110d);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126118f);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261244);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12612f9);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261380);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)in_RCX,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDX);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261403);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12614b7);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(in_RCX,(Index)in_RDX);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(in_R9,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RCX);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126156b);
  *pSVar2 = SVar5 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>::transpose(in_stack_ffffffffffffdac8);
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
               *)in_R9,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_RCX);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)in_R9,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_RCX);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261636);
  *pSVar2 = SVar6;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)in_R9,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_RCX);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)in_R9,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_RCX);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12616e8);
  *pSVar2 = SVar7 + *pSVar2;
  Eigen::operator*(scalar,(StorageBaseType *)matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
               *)in_R9,(MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_RCX);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>,Eigen::Matrix<double,9,9,0,9,9>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>_>
               *)in_R9,(MatrixBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_> *)in_RCX);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_0>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_6>
                      *)in_RCX);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126179e);
  *pSVar2 = SVar7 + *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12617c5);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x12617e8);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x126180c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261830);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261854);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)in_RSI,
                      (Index)in_stack_ffffffffffffdac8,0x1261878);
  *pSVar2 = SVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeG(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const Eigen::Matrix<double,3,9> & x1P,
  const Eigen::Matrix<double,3,9> & y1P,
  const Eigen::Matrix<double,3,9> & z1P,
  const Eigen::Matrix<double,3,9> & x2P,
  const Eigen::Matrix<double,3,9> & y2P,
  const Eigen::Matrix<double,3,9> & z2P,
  const Eigen::Matrix<double,9,9> & m11P,
  const Eigen::Matrix<double,9,9> & m12P,
  const Eigen::Matrix<double,9,9> & m22P,
  const cayley_t & cayley)
{
  Eigen::Matrix4d G;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //todo: Fill the matrix G using the precomputed summation terms
  Eigen::Vector3d xxFr1t = xxF*R.row(1).transpose();
  Eigen::Vector3d yyFr0t = yyF*R.row(0).transpose();
  Eigen::Vector3d zzFr0t = zzF*R.row(0).transpose();
  Eigen::Vector3d yzFr0t = yzF*R.row(0).transpose();
  Eigen::Vector3d xyFr1t = xyF*R.row(1).transpose();
  Eigen::Vector3d xyFr2t = xyF*R.row(2).transpose();
  Eigen::Vector3d zxFr1t = zxF*R.row(1).transpose();
  Eigen::Vector3d zxFr2t = zxF*R.row(2).transpose();
  
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;

  temp =      R.row(2)*yzFr0t;
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyFr2t;
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzFr0t;
  G(0,1) += temp;
  temp =      R.row(1)*zxFr2t;
  G(0,1) += temp;

  temp =      R.row(2)*xyFr1t;
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyFr0t;
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxFr1t;
  G(0,2) += temp;
  temp =      R.row(1)*yzFr0t;
  G(0,2) += temp;

  temp =      R.row(0)*zzFr0t;
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxFr2t;
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;

  temp =      R.row(0)*zxFr1t;
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzFr0t;
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxFr1t;
  G(1,2) += temp;
  temp =      R.row(0)*xyFr2t;
  G(1,2) += temp;

  temp =      R.row(1)*xxFr1t;
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyFr1t;
  G(2,2) += temp;
  temp =      R.row(0)*yyFr0t;
  G(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  Eigen::Matrix<double,9,1> Rowst = Rows.transpose();
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Vector3d x1PC = x1P*Cols;
  Eigen::Vector3d y1PC = y1P*Cols;
  Eigen::Vector3d z1PC = z1P*Cols;
  
  Eigen::Vector3d x2PR = x2P*Rowst;
  Eigen::Vector3d y2PR = y2P*Rowst;
  Eigen::Vector3d z2PR = z2P*Rowst;
  
  temp =      R.row(2)*y1PC;
  G(0,3)  = temp;
  temp =      R.row(2)*y2PR;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1PC;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2PR;
  G(0,3) += temp;
  
  temp =      R.row(0)*z1PC;
  G(1,3)  = temp;
  temp =      R.row(0)*z2PR;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1PC;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2PR;
  G(1,3) += temp;
  
  temp =      R.row(1)*x1PC;
  G(2,3)  = temp;
  temp =      R.row(1)*x2PR;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1PC;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2PR;
  G(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rowst;
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);

  return G;
}